

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCompositeDebugType
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *memberTypes,char *name
          ,NonSemanticShaderDebugInfo100DebugCompositeType tag,bool isOpaqueType)

{
  uint memberType_00;
  bool bVar1;
  Id IVar2;
  Id typeId;
  reference puVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *debugTypeLoc;
  Instruction *pIVar5;
  size_type sVar6;
  reference puVar7;
  mapped_type *this_00;
  bool local_1e1;
  bool local_1d1;
  value_type local_140;
  key_type local_138;
  Id local_134;
  iterator iStack_130;
  uint memberDebugType;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  string local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  string local_a0;
  Instruction *local_80;
  Instruction *type;
  _Node_iterator_base<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_false> local_70;
  _Node_iterator_base<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_false> local_68;
  uint local_5c;
  const_iterator cStack_58;
  uint memberType;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> memberDebugTypes;
  bool isOpaqueType_local;
  NonSemanticShaderDebugInfo100DebugCompositeType tag_local;
  char *name_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *memberTypes_local;
  Builder *this_local;
  
  memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = isOpaqueType;
  memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = tag;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(memberTypes);
  cStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(memberTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_5c = *puVar3;
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spv::Builder::DebugTypeLoc,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>_>
         ::find(&this->debugTypeLocs,&local_5c);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spv::Builder::DebugTypeLoc,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>_>
         ::end(&this->debugTypeLocs);
    bVar1 = std::__detail::operator!=(&local_68,&local_70);
    if (!bVar1) {
      __assert_fail("debugTypeLocs.find(memberType) != debugTypeLocs.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x418,
                    "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                   );
    }
    pmVar4 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_5c);
    memberType_00 = local_5c;
    if (*pmVar4 != 0) {
      debugTypeLoc = std::
                     unordered_map<unsigned_int,_spv::Builder::DebugTypeLoc,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>_>
                     ::operator[](&this->debugTypeLocs,&local_5c);
      type._4_4_ = makeMemberDebugType(this,memberType_00,debugTypeLoc);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                 (uint *)((long)&type + 4));
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  pIVar5 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  typeId = makeVoidType(this);
  spv::Instruction::Instruction(pIVar5,IVar2,typeId,OpExtInst);
  local_80 = pIVar5;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  spv::Instruction::reserveOperands(pIVar5,sVar6 + 0xb);
  spv::Instruction::addIdOperand(local_80,this->nonSemanticShaderDebugInfo);
  spv::Instruction::addImmediateOperand(local_80,10);
  pIVar5 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,name,&local_a1);
  IVar2 = getStringId(this,&local_a0);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pIVar5 = local_80;
  IVar2 = makeUintConstant(this,memberDebugTypes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pIVar5 = local_80;
  IVar2 = makeDebugSource(this,this->currentFileId);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pIVar5 = local_80;
  IVar2 = makeUintConstant(this,this->currentLine,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pIVar5 = local_80;
  IVar2 = makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pIVar5 = local_80;
  IVar2 = makeDebugCompilationUnit(this);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pIVar5 = local_80;
  if ((memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,name,&local_e9);
    std::operator+(&local_c8,'@',&local_e8);
    IVar2 = getStringId(this,&local_c8);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    pIVar5 = local_80;
    IVar2 = makeDebugInfoNone(this);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,name,(allocator<char> *)((long)&__range1_1 + 7));
    IVar2 = getStringId(this,&local_110);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    pIVar5 = local_80;
    IVar2 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
  }
  pIVar5 = local_80;
  IVar2 = makeUintConstant(this,3,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  local_1d1 = true;
  if ((memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    local_1e1 = false;
    if ((memberDebugTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 1) {
      local_1e1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
    }
    local_1d1 = local_1e1;
  }
  if (local_1d1 == false) {
    __assert_fail("isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x437,
                  "Id spv::Builder::makeCompositeDebugType(const std::vector<Id> &, const char *const, const NonSemanticShaderDebugInfo100DebugCompositeType, const bool)"
                 );
  }
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  iStack_130 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xfffffffffffffed0);
    if (!bVar1) break;
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    local_134 = *puVar7;
    spv::Instruction::addIdOperand(local_80,local_134);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_1);
  }
  local_138 = 10;
  this_00 = std::
            unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
            ::operator[](&this->groupedDebugTypes,&local_138);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_00,&local_80)
  ;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_140,
             local_80);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_140);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_140)
  ;
  Module::mapInstruction(&this->module,local_80);
  IVar2 = spv::Instruction::getResultId(local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  return IVar2;
}

Assistant:

Id Builder::makeCompositeDebugType(std::vector<Id> const& memberTypes, char const*const name,
    NonSemanticShaderDebugInfo100DebugCompositeType const tag, bool const isOpaqueType)
{
    // Create the debug member types.
    std::vector<Id> memberDebugTypes;
    for(auto const memberType : memberTypes) {
        assert(debugTypeLocs.find(memberType) != debugTypeLocs.end());

        // There _should_ be debug types for all the member types but currently buffer references
        // do not have member debug info generated.
        if (debugId[memberType])
            memberDebugTypes.emplace_back(makeMemberDebugType(memberType, debugTypeLocs[memberType]));

        // TODO: Need to rethink this method of passing location information.
        // debugTypeLocs.erase(memberType);
    }

    // Create The structure debug type.
    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(memberDebugTypes.size() + 11);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeComposite);
    type->addIdOperand(getStringId(name)); // name id
    type->addIdOperand(makeUintConstant(tag)); // tag id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(currentLine)); // line id TODO: currentLine always zero?
    type->addIdOperand(makeUintConstant(0)); // TODO: column id
    type->addIdOperand(makeDebugCompilationUnit()); // scope id
    if(isOpaqueType == true) {
        // Prepend '@' to opaque types.
        type->addIdOperand(getStringId('@' + std::string(name))); // linkage name id
        type->addIdOperand(makeDebugInfoNone()); // size id
    } else {
        type->addIdOperand(getStringId(name)); // linkage name id
        type->addIdOperand(makeUintConstant(0)); // TODO: size id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id
    assert(isOpaqueType == false || (isOpaqueType == true && memberDebugTypes.empty()));
    for(auto const memberDebugType : memberDebugTypes) {
        type->addIdOperand(memberDebugType);
    }

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeComposite].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}